

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

cmJSONHelper<std::vector<PackagePreset>_> * __thiscall
cmJSONHelperBuilder::
Vector<cmCMakePresetsGraph::PackagePreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>>
          (cmJSONHelper<std::vector<PackagePreset>_> *__return_storage_ptr__,
          cmJSONHelperBuilder *this,ErrorGenerator *error,
          Object<cmCMakePresetsGraph::PackagePreset> *func)

{
  Object<cmCMakePresetsGraph::PackagePreset> local_60;
  
  Object<cmCMakePresetsGraph::PackagePreset>::Object
            (&local_60,(Object<cmCMakePresetsGraph::PackagePreset> *)error);
  VectorFilter<cmCMakePresetsGraph::PackagePreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>,cmJSONHelperBuilder::Vector<cmCMakePresetsGraph::PackagePreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>>(std::function<void(Json::Value_const*,cmJSONState*)>,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>)::_lambda(cmCMakePresetsGraph::PackagePreset_const&)_1_>
            (__return_storage_ptr__,this,&local_60);
  Object<cmCMakePresetsGraph::PackagePreset>::~Object(&local_60);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<std::vector<T>> Vector(JsonErrors::ErrorGenerator error,
                                             F func)
  {
    return VectorFilter<T, F>(std::move(error), func,
                              [](const T&) { return true; });
  }